

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void pop_heap_suite::run(void)

{
  pop_increasing();
  pop_increasing_predicate();
  pop_increasing_custom();
  pop_decreasing();
  pop_decreasing_predicate();
  pop_decreasing_custom();
  pop_sequence();
  pop_sequence_predicate();
  return;
}

Assistant:

void run()
{
    pop_increasing();
    pop_increasing_predicate();
    pop_increasing_custom();
    pop_decreasing();
    pop_decreasing_predicate();
    pop_decreasing_custom();
    pop_sequence();
    pop_sequence_predicate();
}